

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

bool __thiscall MetaCommand::GetOptionWasSet(MetaCommand *this,string *optionName)

{
  bool bVar1;
  __type _Var2;
  iterator __rhs;
  __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  *in_RSI;
  const_iterator it;
  vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  in_stack_ffffffffffffffe0;
  
  __rhs = std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                    (in_stack_ffffffffffffffb8);
  __gnu_cxx::
  __normal_iterator<MetaCommand::Option_const*,std::vector<MetaCommand::Option,std::allocator<MetaCommand::Option>>>
  ::__normal_iterator<MetaCommand::Option*>
            (in_RSI,(__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                     *)in_stack_ffffffffffffffb8);
  while( true ) {
    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
              (in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      (in_RSI,(__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      return false;
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                 *)&stack0xffffffffffffffe0);
    _Var2 = std::operator==(&(in_stack_ffffffffffffffe0._M_current)->name,&(__rhs._M_current)->name)
    ;
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator++((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  return true;
}

Assistant:

bool MetaCommand::
GetOptionWasSet( METAIO_STL::string optionName)
{
  OptionVector::const_iterator it = m_ParsedOptionVector.begin();
  while(it != m_ParsedOptionVector.end())
    {
    if((*it).name == optionName)
      {
      return true;
      }
    ++it;
    }
  return false;
}